

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O3

void recff_rawget(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  RecordIndex ix;
  TValue local_50;
  TValue local_48;
  uint local_20;
  uint local_1c;
  undefined4 local_18;
  undefined4 local_c;
  
  local_20 = *J->base;
  local_1c = J->base[1];
  if (local_1c != 0 && (local_20 & 0x1f000000) == 0xb000000) {
    local_18 = 0;
    local_c = 0;
    local_50.field_2.field_0 = (rd->argv->field_2).field_0;
    local_50.field_2.it = 0xfffffff4;
    local_48 = rd->argv[1];
    TVar1 = lj_record_idx(J,(RecordIndex *)&local_50.field_2);
    *J->base = TVar1;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_rawget(jit_State *J, RecordFFData *rd)
{
  RecordIndex ix;
  ix.tab = J->base[0]; ix.key = J->base[1];
  if (tref_istab(ix.tab) && ix.key) {
    ix.val = 0; ix.idxchain = 0;
    settabV(J->L, &ix.tabv, tabV(&rd->argv[0]));
    copyTV(J->L, &ix.keyv, &rd->argv[1]);
    J->base[0] = lj_record_idx(J, &ix);
  }  /* else: Interpreter will throw. */
}